

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

bool __thiscall HEkk::getBacktrackingBasis(HEkk *this)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  SimplexBasis *in_RDI;
  HighsInt iVar;
  HighsInt num_tot;
  vector<double,_std::allocator<double>_> *in_stack_00000078;
  vector<double,_std::allocator<double>_> *in_stack_00000080;
  SimplexBasis *in_stack_ffffffffffffffd8;
  value_type vVar4;
  int local_18;
  bool local_1;
  
  if (((ulong)in_RDI[0x53].nonbasicMove_.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start & 0x100) == 0) {
    local_1 = false;
  }
  else {
    SimplexBasis::operator=(in_RDI,in_stack_ffffffffffffffd8);
    *(bool *)((long)&in_RDI[0x57].basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4) =
         *(int *)&in_RDI[0x54].nonbasicMove_.
                  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_finish != 0;
    *(bool *)((long)&in_RDI[0x57].basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 5) =
         *(int *)((long)&in_RDI[0x54].nonbasicMove_.
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                         super__Vector_impl_data._M_finish + 4) != 0;
    std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000080,in_stack_00000078);
    iVar1 = in_RDI[0x47].debug_id;
    iVar2 = in_RDI[0x47].debug_update_count;
    for (local_18 = 0; local_18 < iVar1 + iVar2; local_18 = local_18 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&in_RDI[0x55].nonbasicFlag_,
                          (long)local_18);
      vVar4 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[0x5a].basicIndex_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(long)local_18);
      *pvVar3 = vVar4;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool HEkk::getBacktrackingBasis() {
  if (!info_.valid_backtracking_basis_) return false;
  basis_ = info_.backtracking_basis_;
  info_.costs_shifted = (info_.backtracking_basis_costs_shifted_ != 0);
  info_.costs_perturbed = (info_.backtracking_basis_costs_perturbed_ != 0);
  info_.workShift_ = info_.backtracking_basis_workShift_;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  for (HighsInt iVar = 0; iVar < num_tot; iVar++)
    scattered_dual_edge_weight_[iVar] =
        info_.backtracking_basis_edge_weight_[iVar];
  return true;
}